

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.cpp
# Opt level: O1

void __thiscall cppcms::plugin::manager::manager(manager *this)

{
  _Rb_tree_header *p_Var1;
  _data *p_Var2;
  
  p_Var2 = (_data *)operator_new(0x58);
  p_Var1 = &(p_Var2->plugins)._M_t._M_impl.super__Rb_tree_header;
  (p_Var2->plugins)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (p_Var2->plugins)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (p_Var2->plugins)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (p_Var2->plugins)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (p_Var2->lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(p_Var2->lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(p_Var2->lock).super___mutex_base._M_mutex + 0x10) = 0;
  (p_Var2->lock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  *(undefined8 *)&(p_Var2->plugins)._M_t._M_impl = 0;
  *(undefined8 *)&(p_Var2->plugins)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (p_Var2->lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (p_Var2->plugins)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (p_Var2->plugins)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (p_Var2->plugins)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (p_Var2->lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(p_Var2->lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(p_Var2->lock).super___mutex_base._M_mutex + 0x10) = 0;
  (p_Var2->lock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (p_Var2->lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->d).ptr_ = p_Var2;
  return;
}

Assistant:

manager::manager() : d(new manager::_data()) 
{
}